

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

void SDL_WM_SetCaption(char *title,char *icon)

{
  char *local_28;
  char *local_20;
  char *icon_local;
  char *title_local;
  
  if (WindowTitle != (char *)0x0) {
    (*SDL20_free)(WindowTitle);
  }
  if (WindowIconTitle != (char *)0x0) {
    (*SDL20_free)(WindowIconTitle);
  }
  if (title == (char *)0x0) {
    local_20 = (char *)0x0;
  }
  else {
    local_20 = (*SDL20_strdup)(title);
  }
  WindowTitle = local_20;
  if (icon == (char *)0x0) {
    local_28 = (char *)0x0;
  }
  else {
    local_28 = (*SDL20_strdup)(icon);
  }
  WindowIconTitle = local_28;
  if (VideoWindow20 != (SDL_Window *)0x0) {
    (*SDL20_SetWindowTitle)(VideoWindow20,WindowTitle);
  }
  return;
}

Assistant:

SDLCALL
SDL_WM_SetCaption(const char *title, const char *icon)
{
    if (WindowTitle) {
        SDL20_free(WindowTitle);
    }
    if (WindowIconTitle) {
        SDL20_free(WindowIconTitle);
    }
    WindowTitle = title ? SDL20_strdup(title) : NULL;
    WindowIconTitle = icon ? SDL20_strdup(icon) : NULL;
    if (VideoWindow20) {
        SDL20_SetWindowTitle(VideoWindow20, WindowTitle);
    }
}